

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O0

void canonicalize_path(char *path)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  char *in_RDI;
  bool bVar5;
  size_t ele_len;
  int dotcnt;
  char *trimpt;
  char *prvele;
  char *ele;
  char *p;
  char *orig;
  int local_34;
  char *local_28;
  char *local_18;
  char *local_8;
  
  local_34 = 0;
  local_8 = in_RDI;
  while( true ) {
    bVar5 = true;
    if ((*local_8 != '/') && (bVar5 = false, *local_8 != '\0')) {
      pcVar1 = strchr("",(int)*local_8);
      bVar5 = pcVar1 != (char *)0x0;
    }
    if (!bVar5) break;
    local_8 = local_8 + 1;
  }
  local_18 = local_8;
  local_28 = (char *)0x0;
  while (pcVar1 = local_18, *local_18 != '\0') {
    while( true ) {
      bVar5 = false;
      if (*local_18 != '\0') {
        bVar5 = true;
        if ((*local_18 != '/') && (bVar5 = false, *local_18 != '\0')) {
          pcVar2 = strchr("",(int)*local_18);
          bVar5 = pcVar2 != (char *)0x0;
        }
        bVar5 = (bool)(bVar5 ^ 1);
      }
      if (!bVar5) break;
      local_18 = local_18 + 1;
    }
    lVar3 = (long)local_18 - (long)pcVar1;
    while( true ) {
      bVar5 = true;
      if ((*local_18 != '/') && (bVar5 = false, *local_18 != '\0')) {
        pcVar2 = strchr("",(int)*local_18);
        bVar5 = pcVar2 != (char *)0x0;
      }
      if (!bVar5) break;
      local_18 = local_18 + 1;
    }
    if ((lVar3 == 1) && (*pcVar1 == '.')) {
      local_34 = local_34 + 1;
      sVar4 = strlen(local_18);
      memmove(pcVar1,local_18,sVar4 + 1);
      local_18 = pcVar1;
    }
    else if ((lVar3 == 2) && ((*pcVar1 == '.' && (pcVar1[1] == '.')))) {
      local_34 = local_34 + 1;
      if ((((local_28 == (char *)0x0) || (*local_28 == '/')) ||
          ((*local_28 != '\0' && (pcVar2 = strchr("",(int)*local_28), pcVar2 != (char *)0x0)))) ||
         (((*local_28 == '.' && (local_28[1] == '.')) &&
          ((local_28[2] == '/' ||
           ((local_28[2] != '\0' && (pcVar2 = strchr("",(int)local_28[2]), pcVar2 != (char *)0x0))))
          )))) {
        local_28 = (char *)0x0;
      }
      if (local_28 == (char *)0x0) {
        local_28 = pcVar1;
      }
      else {
        sVar4 = strlen(local_18);
        memmove(local_28,local_18,sVar4 + 1);
        local_18 = local_8;
        local_28 = (char *)0x0;
      }
    }
    else {
      local_28 = pcVar1;
    }
  }
  sVar4 = strlen(local_8);
  local_18 = local_8 + sVar4;
  while( true ) {
    bVar5 = false;
    if (((local_8 < local_18) && (bVar5 = true, local_18[-1] != '/')) &&
       (bVar5 = false, local_18[-1] != '\0')) {
      pcVar1 = strchr("",(int)local_18[-1]);
      bVar5 = pcVar1 != (char *)0x0;
    }
    if (!bVar5) break;
    local_18[-1] = '\0';
    local_18 = local_18 + -1;
  }
  if ((*in_RDI == '\0') && (local_34 != 0)) {
    *in_RDI = '.';
    in_RDI[1] = '\0';
  }
  return;
}

Assistant:

void canonicalize_path(char *path)
{
    char *orig = path;
    char *p;
    char *ele, *prvele;
    char *trimpt = 0;
    int dotcnt = 0;

    /* 
     *   First, skip the root element.  This is unremovable.  For Unix, the
     *   root element is simply a leading slash (or series of slashes).  For
     *   DOS/Win, we can also have drive letters and UNC paths (as in
     *   \\MACHINE\ROOT).
     */
#ifdef MSDOS
    /* check for a UNC path or drive letter */
    if (path[0] == '\\' && path[1] == '\\')
    {
        /* skip to the \ after the machine name */
        for (path += 2 ; *path != '\0' && *path != '\\' && *path != '/' ;
             ++path) ;

        /* 
         *   further skip to the slash after that, as the drive name is part
         *   of the root as well 
         */
        if (*path != '\0')
        {
            /* find the slash */
            for (++path ; *path != '\0' && *path != '\\' && *path != '/' ;
                 ++path) ;

            /* we can trim this slash if the path ends here */
            trimpt = path;
        }
    }
    else if (path[1] == ':' && isalpha(path[0]))
    {
        /* skip the drive letter */
        path += 2;
    }
#endif

    /* skip leading slashes */
    for ( ; ispathchar(*path) ; ++path) ;

    /* 
     *   if we didn't choose a different trim starting point, trim from after
     *   the root slashes 
     */
    if (trimpt == 0)
        trimpt = path;

    /* scan elements */
    for (p = ele = path, prvele = 0 ; *ele != '\0' ; )
    {
        size_t ele_len;

        /* find the end of the current element */
        for ( ; *p != '\0' && !ispathchar(*p) ; ++p) ;
        ele_len = p - ele;

        /* skip adjacent path separators */
        for ( ; ispathchar(*p) ; ++p) ;

        /* check for special elements */
        if (ele_len == 1 && ele[0] == '.')
        {
            /* '.' -> current directory; simply remove this element */
            ++dotcnt;
            memmove(ele, p, strlen(p) + 1);

            /* revisit this element */
            p = ele;
        }
        else if (ele_len == 2 && ele[0] == '.' && ele[1] == '.')
        {
            /* 
             *   '..' -> parent directory; remove this element and the
             *   previous element.  If there is no previous element, or the
             *   previous element is a DOS drive letter or root path slash,
             *   we can't remove it.  Leaving a '..' at the root level will
             *   result in an invalid path, but it would change the meaning
             *   to remove it, so leave it intact.
             *   
             *   There's also a special case if the previous element is
             *   another '..'.  If so, it means this was an unremovable '..',
             *   so we can't do any combining - we need to keep this '..'
             *   AND the previous '..' to retain the meaning.
             */
            ++dotcnt;
            if (prvele == 0
                || ispathchar(*prvele)
                || (prvele[0] == '.' && prvele[1] == '.'
                    && ispathchar(prvele[2]))
#ifdef MSDOS
                || (prvele == path && path[1] == ':' && isalpha(path[0]))
#endif
               )
                prvele = 0;

            /* remove the previous element */
            if (prvele != 0)
            {
                /* remove the element */
                memmove(prvele, p, strlen(p) + 1);

                /* 
                 *   start the scan over from the beginning; this is a little
                 *   inefficient, but it's the easiest way to ensure
                 *   accuracy, since we'd otherwise have to back up to find
                 *   the previous element, which can be tricky 
                 */
                p = ele = path;
                prvele = 0;
            }
            else
            {
                /* 
                 *   no previous element, so keep the .. as it is and move on
                 *   to the next element 
                 */
                prvele = ele;
                ele = p;
            }
        }
        else
        {
            /* ordinary element - move on to the next element */
            prvele = ele;
            ele = p;
        }
    }

    /* if we left any trailing slashes, remove them */
    for (p = trimpt + strlen(trimpt) ;
         p > trimpt && ispathchar(*(p-1)) ;
         *--p = '\0') ;

    /*
     *   If that left us with an empty string, and we had one or more "." or
     *   ".."  elements, the "." and ".." elements must have canceled out the
     *   other elements.  In this case return "." as the result. 
     */
    if (orig[0] == '\0' && dotcnt != 0)
    {
        orig[0] = '.';
        orig[1] = '\0';
    }
}